

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O0

void la_miam_xoff_ind_format_text(la_vstring *vstr,void *data,int indent)

{
  int in_EDX;
  ushort *in_RSI;
  la_vstring *in_RDI;
  la_miam_xoff_ind_msg *msg;
  
  if (*in_RSI == 0xfff) {
    la_vstring_append_sprintf(in_RDI,"%*sFile ID: 0xFFF (all)\n",(ulong)(in_EDX + 1U),"");
  }
  else {
    la_vstring_append_sprintf(in_RDI,"%*sFile ID: %u\n",(ulong)(in_EDX + 1U),"",(ulong)*in_RSI);
  }
  return;
}

Assistant:

static void la_miam_xoff_ind_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_xoff_ind_msg const *msg = data;
	indent++;
	if(msg->file_id == 0xFFF) {
		LA_ISPRINTF(vstr, indent, "File ID: 0xFFF (all)\n");
	} else {
		LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	}
}